

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::AppendEnv
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *env)

{
  pointer env_00;
  
  for (env_00 = (env->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      env_00 != (env->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; env_00 = env_00 + 1) {
    cmsys::SystemTools::PutEnv(env_00);
  }
  return;
}

Assistant:

void cmSystemTools::AppendEnv(std::vector<std::string> const& env)
{
  for (std::vector<std::string>::const_iterator eit = env.begin();
       eit != env.end(); ++eit) {
    cmSystemTools::PutEnv(*eit);
  }
}